

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O0

void __thiscall r_exec::AntiPGMController::signal_anti_pgm(AntiPGMController *this)

{
  bool bVar1;
  P *this_00;
  P<r_exec::Overlay> local_38 [3];
  InputLessPGMOverlay *local_20;
  Overlay *overlay;
  lock_guard<std::mutex> guard;
  AntiPGMController *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&overlay,
             &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex);
  if (((this->super__PGMController).field_0x99 & 1) == 0) {
    this_00 = (P *)r_code::list<core::P<r_exec::Overlay>_>::front
                             (&(this->super__PGMController).super_OController.overlays);
    local_20 = (InputLessPGMOverlay *)core::P::operator_cast_to_Overlay_(this_00);
    InputLessPGMOverlay::inject_productions(local_20);
    (*(local_20->super_Overlay).super__Object._vptr__Object[2])();
    if ((((this->super__PGMController).run_once & 1U) == 0) &&
       (bVar1 = Controller::is_alive((Controller *)this), bVar1)) {
      r_code::list<core::P<r_exec::Overlay>_>::clear
                (&(this->super__PGMController).super_OController.overlays);
      core::P<r_exec::Overlay>::P(local_38,&local_20->super_Overlay);
      r_code::list<core::P<r_exec::Overlay>_>::push_back
                (&(this->super__PGMController).super_OController.overlays,local_38);
      core::P<r_exec::Overlay>::~P(local_38);
    }
  }
  else {
    (this->super__PGMController).field_0x99 = 0;
  }
  if (((this->super__PGMController).run_once & 1U) != 0) {
    (*(this->super__PGMController).super_OController.super_Controller.super__Object._vptr__Object[3]
    )();
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&overlay);
  return;
}

Assistant:

void AntiPGMController::signal_anti_pgm()
{
    std::lock_guard<std::mutex> guard(m_reductionMutex);

    if (successful_match) { // a signaling job has been spawn in restart(): we are here in an old job during which a positive match occurred: do nothing.
        successful_match = false;
    } else { // no positive match during this job: inject productions and restart.
        Overlay *overlay = overlays.front();
        ((AntiPGMOverlay *)overlay)->inject_productions();
        overlay->reset(); // reset the first overlay and kill all others.

        if (!run_once && is_alive()) {
            overlays.clear();
            overlays.push_back(overlay);
        }
    }

    if (run_once) {
        invalidate();
    }
}